

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty_validity.hpp
# Opt level: O3

unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true> __thiscall
duckdb::EmptyValidityCompression::InitCompression
          (EmptyValidityCompression *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> *state_p
          )

{
  pointer pAVar1;
  undefined8 *puVar2;
  CompressionFunction *pCVar3;
  
  pAVar1 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::
           operator->(state_p);
  puVar2 = (undefined8 *)operator_new(0x30);
  puVar2[1] = (pAVar1->info).block_manager;
  *puVar2 = &PTR__CompressionState_02467ca0;
  pCVar3 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_EMPTY);
  puVar2[2] = pCVar3;
  puVar2[3] = checkpoint_data;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *(undefined8 **)this = puVar2;
  return (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
         (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)this;
}

Assistant:

static unique_ptr<CompressionState> InitCompression(ColumnDataCheckpointData &checkpoint_data,
	                                                    unique_ptr<AnalyzeState> state_p) {
		return make_uniq<EmptyValidityCompressionState>(checkpoint_data, state_p->info);
	}